

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_two(jpeg_encoder *this,int component_num)

{
  bool bVar1;
  uint uVar2;
  uint len;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  
  bVar10 = component_num != 0;
  iVar7 = (int)this->m_coefficient_array[0];
  iVar3 = this->m_last_dc_val[component_num];
  uVar4 = 0;
  this->m_last_dc_val[component_num] = iVar7;
  uVar8 = iVar7 - iVar3;
  if (uVar8 != 0) {
    uVar5 = -uVar8;
    if (0 < (int)uVar8) {
      uVar5 = uVar8;
    }
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    do {
      uVar4 = uVar4 + 1;
      uVar6 = uVar6 >> 1;
      bVar1 = 1 < uVar5;
      uVar5 = (uint)uVar6;
    } while (bVar1);
  }
  put_bits(this,this->m_huff_codes[bVar10][uVar4],(uint)this->m_huff_code_sizes[bVar10][uVar4]);
  if (uVar4 != 0) {
    put_bits(this,~(-1 << ((byte)uVar4 & 0x1f)) & uVar8 + (iVar7 - iVar3 >> 0x1f),uVar4);
  }
  uVar4 = 0;
  lVar9 = 1;
  do {
    while (uVar8 = (uint)this->m_coefficient_array[lVar9], this->m_coefficient_array[lVar9] == 0) {
      uVar4 = uVar4 + 1;
      lVar9 = lVar9 + 1;
      if (lVar9 == 0x40) {
        if (uVar4 == 0) {
          return;
        }
        put_bits(this,this->m_huff_codes[(ulong)bVar10 + 2][0],
                 (uint)this->m_huff_code_sizes[(ulong)bVar10 + 2][0]);
        return;
      }
    }
    uVar5 = uVar4;
    if (0xf < (int)uVar4) {
      do {
        put_bits(this,this->m_huff_codes[(ulong)bVar10 + 2][0xf0],
                 (uint)this->m_huff_code_sizes[(ulong)bVar10 + 2][0xf0]);
        uVar4 = uVar5 - 0x10;
        bVar1 = 0x1f < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
    }
    uVar5 = -uVar8;
    if (0 < (int)uVar8) {
      uVar5 = uVar8;
    }
    uVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    len = (uVar2 ^ 0xffffffe0) + 0x21;
    if (uVar5 < 2) {
      len = 1;
    }
    iVar3 = uVar4 * 0x10 + len;
    put_bits(this,this->m_huff_codes[(ulong)bVar10 + 2][iVar3],
             (uint)this->m_huff_code_sizes[(ulong)bVar10 + 2][iVar3]);
    put_bits(this,~(-1 << ((byte)len & 0x1f)) & ((int)uVar8 >> 0xf) + uVar8,len);
    lVar9 = lVar9 + 1;
    uVar4 = 0;
  } while (lVar9 != 0x40);
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_two(int component_num)
	{
		int i, j, run_len, nbits, temp1, temp2;
		int16* pSrc = m_coefficient_array;
		uint* codes[2];
		uint8* code_sizes[2];

		if (component_num == 0)
		{
			codes[0] = m_huff_codes[0 + 0]; codes[1] = m_huff_codes[2 + 0];
			code_sizes[0] = m_huff_code_sizes[0 + 0]; code_sizes[1] = m_huff_code_sizes[2 + 0];
		}
		else
		{
			codes[0] = m_huff_codes[0 + 1]; codes[1] = m_huff_codes[2 + 1];
			code_sizes[0] = m_huff_code_sizes[0 + 1]; code_sizes[1] = m_huff_code_sizes[2 + 1];
		}

		temp1 = temp2 = pSrc[0] - m_last_dc_val[component_num];
		m_last_dc_val[component_num] = pSrc[0];

		if (temp1 < 0)
		{
			temp1 = -temp1; temp2--;
		}

		nbits = 0;
		while (temp1)
		{
			nbits++; temp1 >>= 1;
		}

		put_bits(codes[0][nbits], code_sizes[0][nbits]);
		if (nbits) put_bits(temp2 & ((1 << nbits) - 1), nbits);

		for (run_len = 0, i = 1; i < 64; i++)
		{
			if ((temp1 = m_coefficient_array[i]) == 0)
				run_len++;
			else
			{
				while (run_len >= 16)
				{
					put_bits(codes[1][0xF0], code_sizes[1][0xF0]);
					run_len -= 16;
				}
				if ((temp2 = temp1) < 0)
				{
					temp1 = -temp1;
					temp2--;
				}
				nbits = 1;
				while (temp1 >>= 1)
					nbits++;
				j = (run_len << 4) + nbits;
				put_bits(codes[1][j], code_sizes[1][j]);
				put_bits(temp2 & ((1 << nbits) - 1), nbits);
				run_len = 0;
			}
		}
		if (run_len)
			put_bits(codes[1][0], code_sizes[1][0]);
	}